

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

fromBase64_helper_result
anon_unknown.dwarf_a02a25::fromBase64_helper
          (char *input,qsizetype inputSize,char *output,Base64Options options)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  QFlags<QByteArray::Base64Option> QVar4;
  byte bVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  fromBase64_helper_result fVar6;
  int d;
  int ch;
  qsizetype i;
  qsizetype offset;
  int nbits;
  uint buf;
  fromBase64_helper_result result;
  Base64Option in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint local_60;
  long local_58;
  long local_50;
  int local_48;
  uint local_44;
  QFlagsStorageHelper<QByteArray::Base64Option,_4> local_24;
  CompareAgainstLiteralZero local_20;
  CompareAgainstLiteralZero local_1f;
  CompareAgainstLiteralZero local_1e;
  CompareAgainstLiteralZero local_1d [5];
  long local_18;
  undefined4 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_18,0,0x10);
  local_44 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  do {
    if (in_RSI <= local_58) {
      local_18 = local_50;
LAB_004b9e96:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      fVar6.status = local_10;
      fVar6.decodedLength = local_18;
      fVar6._12_4_ = 0;
      return fVar6;
    }
    iVar3 = (int)*(char *)(in_RDI + local_58);
    if ((iVar3 < 0x41) || (0x5a < iVar3)) {
      if ((iVar3 < 0x61) || (0x7a < iVar3)) {
        if ((iVar3 < 0x30) || (0x39 < iVar3)) {
          if (iVar3 == 0x2b) {
            QVar4 = QFlags<QByteArray::Base64Option>::operator&
                              ((QFlags<QByteArray::Base64Option> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff2c);
            QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(local_1d,0);
            bVar2 = ::operator==(QVar4.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                                 super_QFlagsStorage<QByteArray::Base64Option>.i);
            if (bVar2) {
              local_60 = 0x3e;
              goto LAB_004b9dca;
            }
          }
          if (iVar3 == 0x2d) {
            QVar4 = QFlags<QByteArray::Base64Option>::operator&
                              ((QFlags<QByteArray::Base64Option> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff2c);
            QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1e,0);
            bVar2 = ::operator!=(QVar4.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                                 super_QFlagsStorage<QByteArray::Base64Option>.i);
            if (bVar2) {
              local_60 = 0x3e;
              goto LAB_004b9dca;
            }
          }
          if (iVar3 == 0x2f) {
            QVar4 = QFlags<QByteArray::Base64Option>::operator&
                              ((QFlags<QByteArray::Base64Option> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff2c);
            QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1f,0);
            bVar2 = ::operator==(QVar4.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                                 super_QFlagsStorage<QByteArray::Base64Option>.i);
            if (bVar2) {
              local_60 = 0x3f;
              goto LAB_004b9dca;
            }
          }
          if (iVar3 == 0x5f) {
            QVar4 = QFlags<QByteArray::Base64Option>::operator&
                              ((QFlags<QByteArray::Base64Option> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff2c);
            QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_20,0);
            bVar2 = ::operator!=(QVar4.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                                 super_QFlagsStorage<QByteArray::Base64Option>.i);
            if (bVar2) {
              local_60 = 0x3f;
              goto LAB_004b9dca;
            }
          }
          local_24.super_QFlagsStorage<QByteArray::Base64Option>.i =
               (QFlagsStorage<QByteArray::Base64Option>)
               QFlags<QByteArray::Base64Option>::operator&
                         ((QFlags<QByteArray::Base64Option> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c);
          bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_24);
          if (bVar2) {
            if (iVar3 != 0x3d) {
              local_10 = 2;
              goto LAB_004b9e96;
            }
            if (in_RSI % 4 != 0) {
              local_10 = 1;
              goto LAB_004b9e96;
            }
            if ((local_58 != in_RSI + -1) &&
               ((local_58 != in_RSI + -2 ||
                (pcVar1 = (char *)(in_RDI + 1 + local_58), local_58 = local_58 + 1, *pcVar1 != '='))
               )) {
              local_10 = 3;
              goto LAB_004b9e96;
            }
          }
          local_60 = 0xffffffff;
        }
        else {
          local_60 = iVar3 + 4;
        }
      }
      else {
        local_60 = iVar3 - 0x47;
      }
    }
    else {
      local_60 = iVar3 - 0x41;
    }
LAB_004b9dca:
    iVar3 = local_48;
    if (local_60 != 0xffffffff) {
      local_44 = local_44 << 6 | local_60;
      iVar3 = local_48 + 6;
      if (7 < local_48 + 6) {
        bVar5 = (byte)(local_48 + -2);
        *(char *)(in_RDX + local_50) = (char)(local_44 >> (bVar5 & 0x1f));
        local_44 = (1 << (bVar5 & 0x1f)) - 1U & local_44;
        local_50 = local_50 + 1;
        iVar3 = local_48 + -2;
      }
    }
    local_48 = iVar3;
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

fromBase64_helper_result fromBase64_helper(const char *input, qsizetype inputSize,
                                           char *output /* may alias input */,
                                           QByteArray::Base64Options options)
{
    fromBase64_helper_result result{ 0, QByteArray::Base64DecodingStatus::Ok };

    unsigned int buf = 0;
    int nbits = 0;

    qsizetype offset = 0;
    for (qsizetype i = 0; i < inputSize; ++i) {
        int ch = input[i];
        int d;

        if (ch >= 'A' && ch <= 'Z') {
            d = ch - 'A';
        } else if (ch >= 'a' && ch <= 'z') {
            d = ch - 'a' + 26;
        } else if (ch >= '0' && ch <= '9') {
            d = ch - '0' + 52;
        } else if (ch == '+' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 62;
        } else if (ch == '-' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 62;
        } else if (ch == '/' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 63;
        } else if (ch == '_' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 63;
        } else {
            if (options & QByteArray::AbortOnBase64DecodingErrors) {
                if (ch == '=') {
                    // can have 1 or 2 '=' signs, in both cases padding base64Size to
                    // a multiple of 4. Any other case is illegal.
                    if ((inputSize % 4) != 0) {
                        result.status = QByteArray::Base64DecodingStatus::IllegalInputLength;
                        return result;
                    } else if ((i == inputSize - 1) ||
                        (i == inputSize - 2 && input[++i] == '=')) {
                        d = -1; // ... and exit the loop, normally
                    } else {
                        result.status = QByteArray::Base64DecodingStatus::IllegalPadding;
                        return result;
                    }
                } else {
                    result.status = QByteArray::Base64DecodingStatus::IllegalCharacter;
                    return result;
                }
            } else {
                d = -1;
            }
        }

        if (d != -1) {
            buf = (buf << 6) | d;
            nbits += 6;
            if (nbits >= 8) {
                nbits -= 8;
                Q_ASSERT(offset < i);
                output[offset++] = buf >> nbits;
                buf &= (1 << nbits) - 1;
            }
        }
    }

    result.decodedLength = offset;
    return result;
}